

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

char * helicsQueryExecuteComplete(HelicsQuery query,HelicsError *err)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  QueryObject *pQVar2;
  char *pcVar3;
  QueryId local_34;
  string local_30;
  
  pQVar2 = anon_unknown.dwarf_182b7::getQueryObj(query,err);
  if (pQVar2 == (QueryObject *)0x0) {
    pcVar3 = 
    "{{\n  \"error\":{{\n    \"code\":400,\n    \"message\":\"query object is not valid\"\n  }}\n}}"
    ;
  }
  else {
    uVar1 = (pQVar2->asyncIndexCode).ivalue;
    if (uVar1 != 0xffffffff) {
      local_34.ivalue = uVar1;
      helics::Federate::queryComplete_abi_cxx11_
                (&local_30,
                 (pQVar2->activeFed).
                 super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_34);
      helicsQueryExecuteComplete_cold_1();
    }
    pQVar2->activeAsync = false;
    this = (pQVar2->activeFed).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (pQVar2->activeFed).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pQVar2->activeFed).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    (pQVar2->asyncIndexCode).ivalue = 0xffffffff;
    pcVar3 = (pQVar2->response)._M_dataplus._M_p;
  }
  return pcVar3;
}

Assistant:

const char* helicsQueryExecuteComplete(HelicsQuery query, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return invalidQueryObConst;
    }
    try {
        if (queryObj->asyncIndexCode.isValid()) {
            queryObj->response = queryObj->activeFed->queryComplete(queryObj->asyncIndexCode);
        }
        queryObj->activeAsync = false;
        queryObj->activeFed = nullptr;
        queryObj->asyncIndexCode = helics::QueryId();
        return queryObj->response.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return queryErrorString;
    // LCOV_EXCL_STOP
}